

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ml_sse3.c
# Opt level: O0

void av1_nn_propagate_4to4_sse3(float *inputs,float *weights,__m128 *outputs,int num_inputs)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 *puVar3;
  int in_ECX;
  long lVar4;
  float *in_RDX;
  long in_RSI;
  undefined8 *in_RDI;
  __m128 inputs128;
  int local_11c;
  float local_118 [8];
  undefined8 local_f8;
  undefined8 uStack_f0;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  float fStack_84;
  __m128 hh;
  __m128 mul1;
  __m128 weight1;
  __m128 mul0;
  __m128 weight0;
  int i;
  __m128 hadd [2];
  
  local_f8 = *in_RDI;
  uStack_f0 = in_RDI[1];
  for (local_11c = 0; local_11c < 2; local_11c = local_11c + 1) {
    puVar3 = (undefined8 *)(in_RSI + (long)(local_11c * 2 * in_ECX) * 4);
    uVar1 = *puVar3;
    uVar2 = puVar3[1];
    hh[2] = (float)uVar1;
    hh[3] = (float)((ulong)uVar1 >> 0x20);
    mul1[0] = (float)uVar2;
    mul1[1] = (float)((ulong)uVar2 >> 0x20);
    fStack_88 = (float)local_f8;
    fStack_84 = (float)((ulong)local_f8 >> 0x20);
    hh[0] = (float)uStack_f0;
    hh[1] = (float)((ulong)uStack_f0 >> 0x20);
    puVar3 = (undefined8 *)(in_RSI + (long)((local_11c * 2 + 1) * in_ECX) * 4);
    uVar1 = *puVar3;
    uVar2 = puVar3[1];
    local_98 = (float)uVar1;
    fStack_94 = (float)((ulong)uVar1 >> 0x20);
    fStack_90 = (float)uVar2;
    fStack_8c = (float)((ulong)uVar2 >> 0x20);
    lVar4 = (long)local_11c;
    local_118[lVar4 * 4] = hh[2] * fStack_88 + hh[3] * fStack_84;
    local_118[lVar4 * 4 + 1] = mul1[0] * hh[0] + mul1[1] * hh[1];
    local_118[lVar4 * 4 + 2] = local_98 * fStack_88 + fStack_94 * fStack_84;
    local_118[lVar4 * 4 + 3] = fStack_90 * hh[0] + fStack_8c * hh[1];
  }
  weight1[2] = (float)local_118._0_8_;
  weight1[3] = SUB84(local_118._0_8_,4);
  mul0[0] = (float)local_118._8_8_;
  mul0[1] = SUB84(local_118._8_8_,4);
  mul1[2] = (float)local_118._16_8_;
  mul1[3] = SUB84(local_118._16_8_,4);
  weight1[0] = (float)local_118._24_8_;
  weight1[1] = SUB84(local_118._24_8_,4);
  hadd[0][2] = (float)*(undefined8 *)in_RDX;
  hadd[0][3] = (float)((ulong)*(undefined8 *)in_RDX >> 0x20);
  hadd[1][0] = (float)*(undefined8 *)(in_RDX + 2);
  hadd[1][1] = (float)((ulong)*(undefined8 *)(in_RDX + 2) >> 0x20);
  *in_RDX = hadd[0][2] + weight1[2] + weight1[3];
  in_RDX[1] = hadd[0][3] + mul0[0] + mul0[1];
  in_RDX[2] = hadd[1][0] + mul1[2] + mul1[3];
  in_RDX[3] = hadd[1][1] + weight1[0] + weight1[1];
  return;
}

Assistant:

void av1_nn_propagate_4to4_sse3(const float *const inputs,
                                const float *const weights,
                                __m128 *const outputs, const int num_inputs) {
  const __m128 inputs128 = _mm_loadu_ps(inputs);

  __m128 hadd[2];
  for (int i = 0; i < 2; i++) {  // For each pair of outputs
    const __m128 weight0 = _mm_loadu_ps(&weights[2 * i * num_inputs]);
    const __m128 mul0 = _mm_mul_ps(weight0, inputs128);
    const __m128 weight1 = _mm_loadu_ps(&weights[(2 * i + 1) * num_inputs]);
    const __m128 mul1 = _mm_mul_ps(weight1, inputs128);
    hadd[i] = _mm_hadd_ps(mul0, mul1);
  }
  // hadd[0] = [7+6 5+4 3+2 1+0] (weight indices)
  // hadd[1] = [15+14 13+12 11+10 9+8]

  const __m128 hh = _mm_hadd_ps(hadd[0], hadd[1]);
  // [15+14+13+12 11+10+9+8 7+6+5+4 3+2+1+0]

  *outputs = _mm_add_ps(*outputs, hh);
}